

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

ostream * __thiscall nivalis::Plotter::export_binary_func_and_env(Plotter *this,ostream *os)

{
  pointer pFVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  undefined8 local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  util::write_bin<unsigned_long>(os,this->curr_func);
  util::write_bin<unsigned_long>
            (os,((long)(this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->funcs).
                      super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x130);
  lVar2 = 0;
  for (uVar3 = 0;
      pFVar1 = (this->funcs).
               super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x130);
      uVar3 = uVar3 + 1) {
    Function::to_bin((Function *)((long)(pFVar1->line_color).data + lVar2 + -0x20),os);
    lVar2 = lVar2 + 0x130;
  }
  local_38 = (this->view).ymin;
  local_58._0_4_ = (this->view).swid;
  local_58._4_4_ = (this->view).shigh;
  dStack_50 = (this->view).xmax;
  local_48 = (this->view).xmin;
  dStack_40 = (this->view).ymax;
  std::ostream::write((char *)os,(long)&local_58);
  util::write_bin<unsigned_int>(os,this->x_var);
  util::write_bin<unsigned_int>(os,this->y_var);
  util::write_bin<unsigned_int>(os,this->t_var);
  util::write_bin<unsigned_int>(os,this->r_var);
  Environment::to_bin(&this->env,os);
  return os;
}

Assistant:

std::ostream& Plotter::export_binary_func_and_env(std::ostream& os) const {
    util::write_bin(os, curr_func);
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].to_bin(os);
    }
    util::write_bin(os, view);
    util::write_bin(os, x_var);
    util::write_bin(os, y_var);
    util::write_bin(os, t_var);
    util::write_bin(os, r_var);
    env.to_bin(os);
    return os;
}